

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

void mk_sched_event_free(mk_event *event)

{
  mk_sched_worker *pmVar1;
  mk_sched_worker *sched;
  mk_event *event_local;
  
  pmVar1 = mk_sched_get_thread_conf();
  if ((event->type & 0x18U) == 0) {
    event->type = event->type | 0x18;
    mk_list_add(&event->_head,&pmVar1->event_free_queue);
  }
  return;
}

Assistant:

void mk_sched_event_free(struct mk_event *event)
{
    struct mk_sched_worker *sched = mk_sched_get_thread_conf();

    if ((event->type & MK_EVENT_IDLE) != 0) {
        return;
    }

    event->type |= MK_EVENT_IDLE;
    mk_list_add(&event->_head, &sched->event_free_queue);
}